

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

int32_t helicsDataBufferFillFromString(HelicsDataBuffer data,char *str)

{
  SmallBuffer *this;
  size_t sVar1;
  bad_alloc *anon_var_0;
  SmallBuffer *ptr;
  char *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  SmallBuffer *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  this = getBuffer(in_stack_ffffffffffffffb8);
  if (this == (SmallBuffer *)0x0) {
    local_4 = 0;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    helics::ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    sVar1 = helics::SmallBuffer::size(this);
    local_4 = (int32_t)sVar1;
  }
  return local_4;
}

Assistant:

HELICS_EXPORT int32_t helicsDataBufferFillFromString(HelicsDataBuffer data, const char* str)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<std::string_view>::convert(std::string_view(str), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}